

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFComment.cpp
# Opt level: O1

void __thiscall PDFComment::PDFComment(PDFComment *this)

{
  (this->Text)._M_dataplus._M_p = (pointer)&(this->Text).field_2;
  (this->Text)._M_string_length = 0;
  (this->Text).field_2._M_local_buf[0] = '\0';
  (this->CommentatorName)._M_dataplus._M_p = (pointer)&(this->CommentatorName).field_2;
  (this->CommentatorName)._M_string_length = 0;
  (this->CommentatorName).field_2._M_local_buf[0] = '\0';
  CMYKRGBColor::CMYKRGBColor(&this->Color);
  PDFDate::PDFDate(&this->Time);
  PDFDate::SetToCurrentTime(&this->Time);
  this->ReplyTo = (PDFComment *)0x0;
  this->FrameBoundings[0] = 0.0;
  this->FrameBoundings[1] = 0.0;
  this->FrameBoundings[2] = 0.0;
  this->FrameBoundings[3] = 0.0;
  return;
}

Assistant:

PDFComment::PDFComment(void)
{
	Time.SetToCurrentTime();
	ReplyTo = NULL;
	FrameBoundings[0] = FrameBoundings[1] = FrameBoundings[2] = FrameBoundings[3] = 0.0;
}